

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O2

UBool __thiscall icu_63::RuleBasedTimeZone::hasSameRules(RuleBasedTimeZone *this,TimeZone *other)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  UBool UVar4;
  
  UVar4 = '\x01';
  if ((this != (RuleBasedTimeZone *)other) &&
     ((((bVar1 = std::type_info::operator!=
                           ((type_info *)
                            (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
                            [-1],(type_info *)(other->super_UObject)._vptr_UObject[-1]), bVar1 ||
        (iVar3 = (*(this->fInitialRule->super_TimeZoneRule).super_UObject._vptr_UObject[5])
                           (this->fInitialRule,other[1].super_UObject._vptr_UObject),
        (char)iVar3 != '\0')) ||
       (UVar2 = compareRules(this->fHistoricRules,
                             (UVector *)other[1].fID.super_Replaceable.super_UObject._vptr_UObject),
       UVar2 == '\0')) ||
      (UVar2 = compareRules(this->fFinalRules,*(UVector **)&other[1].fID.fUnion), UVar2 == '\0'))))
  {
    UVar4 = '\0';
  }
  return UVar4;
}

Assistant:

UBool
RuleBasedTimeZone::hasSameRules(const TimeZone& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (typeid(*this) != typeid(other)) {
        return FALSE;
    }
    const RuleBasedTimeZone& that = (const RuleBasedTimeZone&)other;
    if (*fInitialRule != *(that.fInitialRule)) {
        return FALSE;
    }
    if (compareRules(fHistoricRules, that.fHistoricRules)
        && compareRules(fFinalRules, that.fFinalRules)) {
        return TRUE;
    }
    return FALSE;
}